

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_list_stroke_poly_line
               (nk_draw_list *list,nk_vec2 *points,uint points_count,nk_color color,
               nk_draw_list_stroke closed,float thickness,nk_anti_aliasing aliasing)

{
  nk_convert_config *config;
  undefined8 *puVar1;
  nk_vec2 nVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  nk_vec2 pos;
  nk_vec2 pos_00;
  nk_vec2 pos_01;
  nk_vec2 pos_02;
  short sVar6;
  short sVar7;
  nk_draw_index nVar8;
  void *pvVar9;
  nk_draw_index *pnVar10;
  undefined8 *puVar11;
  long lVar12;
  ulong uVar13;
  nk_draw_index nVar14;
  nk_draw_index nVar15;
  ulong uVar16;
  ulong uVar17;
  float fVar18;
  uint uVar19;
  nk_draw_index nVar20;
  uint uVar21;
  nk_draw_index nVar22;
  ulong uVar23;
  nk_size nVar24;
  long lVar25;
  ulong uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  nk_colorf color_03;
  nk_colorf color_04;
  nk_colorf color_05;
  nk_colorf color_06;
  nk_colorf color_07;
  nk_colorf color_08;
  nk_colorf color_09;
  nk_colorf color_10;
  nk_colorf col;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x2549,
                  "void nk_draw_list_stroke_poly_line(struct nk_draw_list *, const struct nk_vec2 *, const unsigned int, struct nk_color, enum nk_draw_list_stroke, float, enum nk_anti_aliasing)"
                 );
  }
  if (points_count < 2) {
    return;
  }
  fVar18 = (list->config).global_alpha;
  uVar23 = (ulong)points_count;
  uVar19 = points_count - 1;
  uVar16 = (ulong)uVar19;
  uVar13 = uVar23;
  if (closed == NK_STROKE_OPEN) {
    uVar13 = uVar16;
  }
  config = &list->config;
  nk_color_fv(&col.r,(nk_color)
                     ((uint)color & 0xffffff |
                     (int)((float)((int)((float)((uint)color >> 0x18) * fVar18) & 0xff) * fVar18) <<
                     0x18));
  uVar3 = list->vertex_count;
  if (aliasing != NK_ANTI_ALIASING_ON) {
    pvVar9 = nk_draw_list_alloc_vertices(list,uVar13 << 2);
    pnVar10 = nk_draw_list_alloc_elements(list,uVar13 * 6);
    if (pnVar10 == (nk_draw_index *)0x0 || pvVar9 == (void *)0x0) {
      return;
    }
    lVar25 = 1;
    for (nVar24 = 0; uVar13 << 2 != nVar24; nVar24 = nVar24 + 4) {
      lVar12 = lVar25;
      if (uVar23 * 4 - 4 == nVar24) {
        lVar12 = 0;
      }
      fVar18 = *(float *)((long)&points->x + nVar24 * 2);
      fVar30 = *(float *)((long)&points->y + nVar24 * 2);
      fVar31 = points[lVar12].x;
      fVar32 = points[lVar12].y;
      fVar27 = fVar31 - fVar18;
      fVar28 = fVar32 - fVar30;
      fVar33 = fVar27 * fVar27 + fVar28 * fVar28;
      fVar29 = 1.0;
      if ((fVar33 != 0.0) || (NAN(fVar33))) {
        fVar29 = (float)(0x5f375a84 - ((uint)fVar33 >> 1));
        fVar29 = (fVar33 * -0.5 * fVar29 * fVar29 + 1.5) * fVar29;
      }
      sVar6 = (short)uVar3;
      sVar7 = (short)nVar24;
      nVar2 = (list->config).null.uv;
      fVar33 = fVar27 * fVar29 * thickness * 0.5;
      fVar29 = fVar28 * fVar29 * thickness * 0.5;
      color_00.b = col.b;
      color_00.a = col.a;
      color_00.r = col.r;
      color_00.g = col.g;
      pos.y = fVar30 - fVar33;
      pos.x = fVar18 + fVar29;
      pvVar9 = nk_draw_vertex(pvVar9,config,pos,nVar2,color_00);
      color_01.b = col.b;
      color_01.a = col.a;
      color_01.r = col.r;
      color_01.g = col.g;
      pos_00.y = fVar32 - fVar33;
      pos_00.x = fVar31 + fVar29;
      pvVar9 = nk_draw_vertex(pvVar9,config,pos_00,nVar2,color_01);
      color_02.b = col.b;
      color_02.a = col.a;
      color_02.r = col.r;
      color_02.g = col.g;
      pos_01.y = fVar32 + fVar33;
      pos_01.x = fVar31 - fVar29;
      pvVar9 = nk_draw_vertex(pvVar9,config,pos_01,nVar2,color_02);
      color_03.b = col.b;
      color_03.a = col.a;
      color_03.r = col.r;
      color_03.g = col.g;
      pos_02.y = fVar33 + fVar30;
      pos_02.x = fVar18 - fVar29;
      pvVar9 = nk_draw_vertex(pvVar9,config,pos_02,nVar2,color_03);
      *pnVar10 = sVar6 + sVar7;
      pnVar10[1] = sVar6 + sVar7 + 1;
      nVar8 = sVar6 + 2 + sVar7;
      pnVar10[2] = nVar8;
      pnVar10[3] = sVar6 + sVar7;
      pnVar10[4] = nVar8;
      pnVar10[5] = sVar6 + sVar7 + 3;
      pnVar10 = pnVar10 + 6;
      lVar25 = lVar25 + 1;
    }
    return;
  }
  lVar25 = 0xc;
  if (1.0 < thickness) {
    lVar25 = 0x12;
  }
  uVar21 = points_count * 3;
  if (1.0 < thickness) {
    uVar21 = points_count * 4;
  }
  pvVar9 = nk_draw_list_alloc_vertices(list,(ulong)uVar21);
  pnVar10 = nk_draw_list_alloc_elements(list,lVar25 * uVar13);
  if (pvVar9 == (void *)0x0) {
    return;
  }
  if (pnVar10 == (nk_draw_index *)0x0) {
    return;
  }
  pvVar4 = (list->vertices->memory).ptr;
  nk_buffer_mark(list->vertices,NK_BUFFER_FRONT);
  puVar11 = (undefined8 *)
            nk_buffer_alloc(list->vertices,NK_BUFFER_FRONT,
                            ((ulong)(1.0 < thickness) * 0x10 + 0x18) * uVar23,4);
  if (puVar11 == (undefined8 *)0x0) {
    return;
  }
  uVar26 = col._8_8_ & 0xffffffff;
  pvVar5 = (list->vertices->memory).ptr;
  lVar25 = -uVar13;
  for (uVar13 = 1; lVar25 + uVar13 != 1; uVar13 = uVar13 + 1) {
    uVar17 = uVar13;
    if (uVar23 == uVar13) {
      uVar17 = 0;
    }
    fVar31 = points[uVar17].x - points[uVar13 - 1].x;
    fVar30 = points[uVar17].y - points[uVar13 - 1].y;
    fVar32 = fVar31 * fVar31 + fVar30 * fVar30;
    fVar18 = 1.0;
    if ((fVar32 != 0.0) || (NAN(fVar32))) {
      fVar18 = (float)(0x5f375a84 - ((uint)fVar32 >> 1));
      fVar18 = (fVar32 * -0.5 * fVar18 * fVar18 + 1.5) * fVar18;
    }
    puVar11[uVar13 - 1] = CONCAT44(fVar18 * -fVar31,fVar18 * fVar30);
  }
  pvVar9 = (void *)((long)pvVar9 + ((long)pvVar5 - (long)pvVar4));
  puVar1 = puVar11 + uVar23;
  if (closed == NK_STROKE_OPEN) {
    puVar11[uVar16] = puVar11[points_count - 2];
    if (thickness <= 1.0) {
      fVar18 = (float)*puVar11;
      fVar30 = (float)((ulong)*puVar11 >> 0x20);
      *puVar1 = CONCAT44((*points).y + fVar30,(*points).x + fVar18);
      puVar1[1] = CONCAT44((*points).y - fVar30,(*points).x - fVar18);
      fVar18 = (float)puVar11[uVar16];
      fVar30 = (float)((ulong)puVar11[uVar16] >> 0x20);
      puVar1[uVar19 * 2] = CONCAT44(points[uVar16].y + fVar30,points[uVar16].x + fVar18);
      puVar1[(ulong)(uVar19 * 2) + 1] =
           CONCAT44(points[uVar16].y - fVar30,points[uVar16].x - fVar18);
      goto LAB_0011f91e;
    }
    fVar33 = (thickness + -1.0) * 0.5;
    fVar18 = fVar33 + 1.0;
    fVar30 = (float)*puVar11;
    fVar32 = fVar18 * fVar30;
    fVar31 = (float)((ulong)*puVar11 >> 0x20);
    fVar29 = fVar18 * fVar31;
    *puVar1 = CONCAT44((*points).y + fVar29,(*points).x + fVar32);
    fVar30 = fVar30 * fVar33;
    fVar31 = fVar31 * fVar33;
    puVar1[1] = CONCAT44((*points).y + fVar31,(*points).x + fVar30);
    puVar1[2] = CONCAT44((*points).y - fVar31,(*points).x - fVar30);
    puVar1[3] = CONCAT44((*points).y - fVar29,(*points).x - fVar32);
    uVar13 = (ulong)(uVar19 * 4);
    fVar32 = (float)puVar11[uVar16];
    fVar30 = fVar18 * fVar32;
    fVar29 = (float)((ulong)puVar11[uVar16] >> 0x20);
    fVar31 = fVar18 * fVar29;
    puVar1[uVar13] = CONCAT44(points[uVar16].y + fVar31,points[uVar16].x + fVar30);
    fVar32 = fVar33 * fVar32;
    fVar29 = fVar33 * fVar29;
    puVar1[uVar13 + 1] = CONCAT44(points[uVar16].y + fVar29,points[uVar16].x + fVar32);
    puVar1[uVar13 + 2] = CONCAT44(points[uVar16].y - fVar29,points[uVar16].x - fVar32);
    puVar1[uVar13 + 3] = CONCAT44(points[uVar16].y - fVar31,points[uVar16].x - fVar30);
  }
  else {
    if (thickness <= 1.0) {
LAB_0011f91e:
      uVar19 = uVar3;
      for (uVar13 = 1; lVar25 + uVar13 != 1; uVar13 = uVar13 + 1) {
        uVar16 = uVar13;
        uVar21 = uVar19 + 3;
        if (uVar23 == uVar13) {
          uVar16 = 0;
          uVar21 = uVar3;
        }
        fVar18 = ((float)puVar11[uVar16] + (float)puVar11[uVar13 - 1]) * 0.5;
        fVar30 = ((float)((ulong)puVar11[uVar16] >> 0x20) +
                 (float)((ulong)puVar11[uVar13 - 1] >> 0x20)) * 0.5;
        fVar31 = fVar18 * fVar18 + fVar30 * fVar30;
        if (1e-06 < fVar31) {
          fVar31 = 1.0 / fVar31;
          fVar32 = 100.0;
          if (fVar31 <= 100.0) {
            fVar32 = fVar31;
          }
          fVar18 = fVar18 * fVar32;
          fVar30 = fVar30 * fVar32;
        }
        puVar1[uVar16 * 2] = CONCAT44(points[uVar16].y + fVar30,points[uVar16].x + fVar18);
        puVar1[uVar16 * 2 + 1] = CONCAT44(points[uVar16].y - fVar30,points[uVar16].x - fVar18);
        nVar20 = (nk_draw_index)uVar21;
        *pnVar10 = nVar20;
        nVar8 = (nk_draw_index)uVar19;
        pnVar10[1] = nVar8;
        pnVar10[2] = nVar8 + 2;
        pnVar10[3] = nVar8 + 2;
        pnVar10[4] = nVar20 + 2;
        pnVar10[5] = nVar20;
        pnVar10[6] = nVar20 + 1;
        pnVar10[7] = nVar8 + 1;
        pnVar10[8] = nVar8;
        pnVar10[9] = nVar8;
        pnVar10[10] = nVar20;
        pnVar10[0xb] = nVar20 + 1;
        pnVar10 = pnVar10 + 0xc;
        uVar19 = uVar21;
      }
      for (lVar25 = 0; uVar23 << 3 != lVar25; lVar25 = lVar25 + 8) {
        nVar2 = (list->config).null.uv;
        color_08.b = col.b;
        color_08.a = col.a;
        color_08.r = col.r;
        color_08.g = col.g;
        pvVar9 = nk_draw_vertex(pvVar9,config,*(nk_vec2 *)((long)&points->x + lVar25),nVar2,color_08
                               );
        color_09.b = (float)(int)uVar26;
        color_09.a = (float)(int)(uVar26 >> 0x20);
        color_09.r = col.r;
        color_09.g = col.g;
        pvVar9 = nk_draw_vertex(pvVar9,config,*(nk_vec2 *)((long)puVar11 + lVar25 * 2 + uVar23 * 8),
                                nVar2,color_09);
        color_10.b = (float)(int)uVar26;
        color_10.a = (float)(int)(uVar26 >> 0x20);
        color_10.r = col.r;
        color_10.g = col.g;
        pvVar9 = nk_draw_vertex(pvVar9,config,
                                *(nk_vec2 *)((long)puVar11 + lVar25 * 2 + uVar23 * 8 + 8),nVar2,
                                color_10);
      }
      goto LAB_0011faba;
    }
    fVar33 = (thickness + -1.0) * 0.5;
    fVar18 = fVar33 + 1.0;
  }
  uVar19 = uVar3;
  for (uVar13 = 1; lVar25 + uVar13 != 1; uVar13 = uVar13 + 1) {
    uVar16 = uVar13;
    uVar21 = uVar19 + 4;
    if (uVar23 == uVar13) {
      uVar16 = 0;
      uVar21 = uVar3;
    }
    fVar30 = ((float)puVar11[uVar16] + (float)puVar11[uVar13 - 1]) * 0.5;
    fVar31 = ((float)((ulong)puVar11[uVar16] >> 0x20) + (float)((ulong)puVar11[uVar13 - 1] >> 0x20))
             * 0.5;
    fVar32 = fVar30 * fVar30 + fVar31 * fVar31;
    if (1e-06 < fVar32) {
      fVar32 = 1.0 / fVar32;
      fVar29 = 100.0;
      if (fVar32 <= 100.0) {
        fVar29 = fVar32;
      }
      fVar30 = fVar30 * fVar29;
      fVar31 = fVar31 * fVar29;
    }
    puVar1[uVar16 * 4] =
         CONCAT44(points[uVar16].y + fVar18 * fVar31,points[uVar16].x + fVar18 * fVar30);
    puVar1[uVar16 * 4 + 1] =
         CONCAT44(points[uVar16].y + fVar31 * fVar33,points[uVar16].x + fVar30 * fVar33);
    puVar1[uVar16 * 4 + 2] =
         CONCAT44(points[uVar16].y - fVar31 * fVar33,points[uVar16].x - fVar30 * fVar33);
    puVar1[uVar16 * 4 + 3] =
         CONCAT44(points[uVar16].y - fVar18 * fVar31,points[uVar16].x - fVar18 * fVar30);
    nVar8 = (nk_draw_index)uVar21;
    nVar22 = nVar8 + 1;
    *pnVar10 = nVar22;
    nVar20 = (nk_draw_index)uVar19;
    pnVar10[1] = nVar20 + 1;
    nVar14 = nVar20 + 2;
    pnVar10[2] = nVar14;
    pnVar10[3] = nVar14;
    nVar15 = nVar8 + 2;
    pnVar10[4] = nVar15;
    pnVar10[5] = nVar22;
    pnVar10[6] = nVar22;
    pnVar10[7] = nVar20 + 1;
    pnVar10[8] = nVar20;
    pnVar10[9] = nVar20;
    pnVar10[10] = nVar8;
    pnVar10[0xb] = nVar22;
    pnVar10[0xc] = nVar15;
    pnVar10[0xd] = nVar14;
    pnVar10[0xe] = nVar20 + 3;
    pnVar10[0xf] = nVar20 + 3;
    pnVar10[0x10] = nVar8 + 3;
    pnVar10[0x11] = nVar15;
    pnVar10 = pnVar10 + 0x12;
    uVar19 = uVar21;
  }
  for (lVar25 = 0; uVar23 << 5 != lVar25; lVar25 = lVar25 + 0x20) {
    nVar2 = (list->config).null.uv;
    color_04.b = (float)(int)uVar26;
    color_04.a = (float)(int)(uVar26 >> 0x20);
    color_04.r = col.r;
    color_04.g = col.g;
    pvVar9 = nk_draw_vertex(pvVar9,config,*(nk_vec2 *)((long)puVar11 + lVar25 + uVar23 * 8),nVar2,
                            color_04);
    color_05.b = col.b;
    color_05.a = col.a;
    color_05.r = col.r;
    color_05.g = col.g;
    pvVar9 = nk_draw_vertex(pvVar9,config,*(nk_vec2 *)((long)puVar11 + lVar25 + uVar23 * 8 + 8),
                            nVar2,color_05);
    color_06.b = col.b;
    color_06.a = col.a;
    color_06.r = col.r;
    color_06.g = col.g;
    pvVar9 = nk_draw_vertex(pvVar9,config,*(nk_vec2 *)((long)puVar11 + lVar25 + uVar23 * 8 + 0x10),
                            nVar2,color_06);
    color_07.b = (float)(int)uVar26;
    color_07.a = (float)(int)(uVar26 >> 0x20);
    color_07.r = col.r;
    color_07.g = col.g;
    pvVar9 = nk_draw_vertex(pvVar9,config,*(nk_vec2 *)((long)puVar11 + lVar25 + uVar23 * 8 + 0x18),
                            nVar2,color_07);
  }
LAB_0011faba:
  nk_buffer_reset(list->vertices,NK_BUFFER_FRONT);
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_poly_line(struct nk_draw_list *list, const struct nk_vec2 *points,
    const unsigned int points_count, struct nk_color color, enum nk_draw_list_stroke closed,
    float thickness, enum nk_anti_aliasing aliasing)
{
    nk_size count;
    int thick_line;
    struct nk_colorf col;
    struct nk_colorf col_trans;
    NK_ASSERT(list);
    if (!list || points_count < 2) return;

    color.a = (nk_byte)((float)color.a * list->config.global_alpha);
    count = points_count;
    if (!closed) count = points_count-1;
    thick_line = thickness > 1.0f;

#ifdef NK_INCLUDE_COMMAND_USERDATA
    nk_draw_list_push_userdata(list, list->userdata);
#endif

    color.a = (nk_byte)((float)color.a * list->config.global_alpha);
    nk_color_fv(&col.r, color);
    col_trans = col;
    col_trans.a = 0;

    if (aliasing == NK_ANTI_ALIASING_ON) {
        /* ANTI-ALIASED STROKE */
        const float AA_SIZE = 1.0f;
        NK_STORAGE const nk_size pnt_align = NK_ALIGNOF(struct nk_vec2);
        NK_STORAGE const nk_size pnt_size = sizeof(struct nk_vec2);

        /* allocate vertices and elements  */
        nk_size i1 = 0;
        nk_size vertex_offset;
        nk_size index = list->vertex_count;

        const nk_size idx_count = (thick_line) ?  (count * 18) : (count * 12);
        const nk_size vtx_count = (thick_line) ? (points_count * 4): (points_count *3);

        void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
        nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

        nk_size size;
        struct nk_vec2 *normals, *temp;
        if (!vtx || !ids) return;

        /* temporary allocate normals + points */
        vertex_offset = (nk_size)((nk_byte*)vtx - (nk_byte*)list->vertices->memory.ptr);
        nk_buffer_mark(list->vertices, NK_BUFFER_FRONT);
        size = pnt_size * ((thick_line) ? 5 : 3) * points_count;
        normals = (struct nk_vec2*) nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT, size, pnt_align);
        if (!normals) return;
        temp = normals + points_count;

        /* make sure vertex pointer is still correct */
        vtx = (void*)((nk_byte*)list->vertices->memory.ptr + vertex_offset);

        /* calculate normals */
        for (i1 = 0; i1 < count; ++i1) {
            const nk_size i2 = ((i1 + 1) == points_count) ? 0 : (i1 + 1);
            struct nk_vec2 diff = nk_vec2_sub(points[i2], points[i1]);
            float len;

            /* vec2 inverted length  */
            len = nk_vec2_len_sqr(diff);
            if (len != 0.0f)
                len = nk_inv_sqrt(len);
            else len = 1.0f;

            diff = nk_vec2_muls(diff, len);
            normals[i1].x = diff.y;
            normals[i1].y = -diff.x;
        }

        if (!closed)
            normals[points_count-1] = normals[points_count-2];

        if (!thick_line) {
            nk_size idx1, i;
            if (!closed) {
                struct nk_vec2 d;
                temp[0] = nk_vec2_add(points[0], nk_vec2_muls(normals[0], AA_SIZE));
                temp[1] = nk_vec2_sub(points[0], nk_vec2_muls(normals[0], AA_SIZE));
                d = nk_vec2_muls(normals[points_count-1], AA_SIZE);
                temp[(points_count-1) * 2 + 0] = nk_vec2_add(points[points_count-1], d);
                temp[(points_count-1) * 2 + 1] = nk_vec2_sub(points[points_count-1], d);
            }

            /* fill elements */
            idx1 = index;
            for (i1 = 0; i1 < count; i1++) {
                struct nk_vec2 dm;
                float dmr2;
                nk_size i2 = ((i1 + 1) == points_count) ? 0 : (i1 + 1);
                nk_size idx2 = ((i1+1) == points_count) ? index: (idx1 + 3);

                /* average normals */
                dm = nk_vec2_muls(nk_vec2_add(normals[i1], normals[i2]), 0.5f);
                dmr2 = dm.x * dm.x + dm.y* dm.y;
                if (dmr2 > 0.000001f) {
                    float scale = 1.0f/dmr2;
                    scale = NK_MIN(100.0f, scale);
                    dm = nk_vec2_muls(dm, scale);
                }

                dm = nk_vec2_muls(dm, AA_SIZE);
                temp[i2*2+0] = nk_vec2_add(points[i2], dm);
                temp[i2*2+1] = nk_vec2_sub(points[i2], dm);

                ids[0] = (nk_draw_index)(idx2 + 0); ids[1] = (nk_draw_index)(idx1+0);
                ids[2] = (nk_draw_index)(idx1 + 2); ids[3] = (nk_draw_index)(idx1+2);
                ids[4] = (nk_draw_index)(idx2 + 2); ids[5] = (nk_draw_index)(idx2+0);
                ids[6] = (nk_draw_index)(idx2 + 1); ids[7] = (nk_draw_index)(idx1+1);
                ids[8] = (nk_draw_index)(idx1 + 0); ids[9] = (nk_draw_index)(idx1+0);
                ids[10]= (nk_draw_index)(idx2 + 0); ids[11]= (nk_draw_index)(idx2+1);
                ids += 12;
                idx1 = idx2;
            }

            /* fill vertices */
            for (i = 0; i < points_count; ++i) {
                const struct nk_vec2 uv = list->config.null.uv;
                vtx = nk_draw_vertex(vtx, &list->config, points[i], uv, col);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*2+0], uv, col_trans);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*2+1], uv, col_trans);
            }
        } else {
            nk_size idx1, i;
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed) {
                struct nk_vec2 d1 = nk_vec2_muls(normals[0], half_inner_thickness + AA_SIZE);
                struct nk_vec2 d2 = nk_vec2_muls(normals[0], half_inner_thickness);

                temp[0] = nk_vec2_add(points[0], d1);
                temp[1] = nk_vec2_add(points[0], d2);
                temp[2] = nk_vec2_sub(points[0], d2);
                temp[3] = nk_vec2_sub(points[0], d1);

                d1 = nk_vec2_muls(normals[points_count-1], half_inner_thickness + AA_SIZE);
                d2 = nk_vec2_muls(normals[points_count-1], half_inner_thickness);

                temp[(points_count-1)*4+0] = nk_vec2_add(points[points_count-1], d1);
                temp[(points_count-1)*4+1] = nk_vec2_add(points[points_count-1], d2);
                temp[(points_count-1)*4+2] = nk_vec2_sub(points[points_count-1], d2);
                temp[(points_count-1)*4+3] = nk_vec2_sub(points[points_count-1], d1);
            }

            /* add all elements */
            idx1 = index;
            for (i1 = 0; i1 < count; ++i1) {
                struct nk_vec2 dm_out, dm_in;
                const nk_size i2 = ((i1+1) == points_count) ? 0: (i1 + 1);
                nk_size idx2 = ((i1+1) == points_count) ? index: (idx1 + 4);

                /* average normals */
                struct nk_vec2 dm = nk_vec2_muls(nk_vec2_add(normals[i1], normals[i2]), 0.5f);
                float dmr2 = dm.x * dm.x + dm.y* dm.y;
                if (dmr2 > 0.000001f) {
                    float scale = 1.0f/dmr2;
                    scale = NK_MIN(100.0f, scale);
                    dm = nk_vec2_muls(dm, scale);
                }

                dm_out = nk_vec2_muls(dm, ((half_inner_thickness) + AA_SIZE));
                dm_in = nk_vec2_muls(dm, half_inner_thickness);
                temp[i2*4+0] = nk_vec2_add(points[i2], dm_out);
                temp[i2*4+1] = nk_vec2_add(points[i2], dm_in);
                temp[i2*4+2] = nk_vec2_sub(points[i2], dm_in);
                temp[i2*4+3] = nk_vec2_sub(points[i2], dm_out);

                /* add indexes */
                ids[0] = (nk_draw_index)(idx2 + 1); ids[1] = (nk_draw_index)(idx1+1);
                ids[2] = (nk_draw_index)(idx1 + 2); ids[3] = (nk_draw_index)(idx1+2);
                ids[4] = (nk_draw_index)(idx2 + 2); ids[5] = (nk_draw_index)(idx2+1);
                ids[6] = (nk_draw_index)(idx2 + 1); ids[7] = (nk_draw_index)(idx1+1);
                ids[8] = (nk_draw_index)(idx1 + 0); ids[9] = (nk_draw_index)(idx1+0);
                ids[10]= (nk_draw_index)(idx2 + 0); ids[11] = (nk_draw_index)(idx2+1);
                ids[12]= (nk_draw_index)(idx2 + 2); ids[13] = (nk_draw_index)(idx1+2);
                ids[14]= (nk_draw_index)(idx1 + 3); ids[15] = (nk_draw_index)(idx1+3);
                ids[16]= (nk_draw_index)(idx2 + 3); ids[17] = (nk_draw_index)(idx2+2);
                ids += 18;
                idx1 = idx2;
            }

            /* add vertices */
            for (i = 0; i < points_count; ++i) {
                const struct nk_vec2 uv = list->config.null.uv;
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+0], uv, col_trans);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+1], uv, col);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+2], uv, col);
                vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+3], uv, col_trans);
            }
        }
        /* free temporary normals + points */
        nk_buffer_reset(list->vertices, NK_BUFFER_FRONT);
    } else {
        /* NON ANTI-ALIASED STROKE */
        nk_size i1 = 0;
        nk_size idx = list->vertex_count;
        const nk_size idx_count = count * 6;
        const nk_size vtx_count = count * 4;
        void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
        nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);
        if (!vtx || !ids) return;

        for (i1 = 0; i1 < count; ++i1) {
            float dx, dy;
            const struct nk_vec2 uv = list->config.null.uv;
            const nk_size i2 = ((i1+1) == points_count) ? 0 : i1 + 1;
            const struct nk_vec2 p1 = points[i1];
            const struct nk_vec2 p2 = points[i2];
            struct nk_vec2 diff = nk_vec2_sub(p2, p1);
            float len;

            /* vec2 inverted length  */
            len = nk_vec2_len_sqr(diff);
            if (len != 0.0f)
                len = nk_inv_sqrt(len);
            else len = 1.0f;
            diff = nk_vec2_muls(diff, len);

            /* add vertices */
            dx = diff.x * (thickness * 0.5f);
            dy = diff.y * (thickness * 0.5f);

            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p1.x + dy, p1.y - dx), uv, col);
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p2.x + dy, p2.y - dx), uv, col);
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p2.x - dy, p2.y + dx), uv, col);
            vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p1.x - dy, p1.y + dx), uv, col);

            ids[0] = (nk_draw_index)(idx+0); ids[1] = (nk_draw_index)(idx+1);
            ids[2] = (nk_draw_index)(idx+2); ids[3] = (nk_draw_index)(idx+0);
            ids[4] = (nk_draw_index)(idx+2); ids[5] = (nk_draw_index)(idx+3);

            ids += 6;
            idx += 4;
        }
    }
}